

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirlisting.cpp
# Opt level: O3

void __thiscall QDirListingPrivate::advance(QDirListingPrivate *this)

{
  QAbstractFileEngineIterator *pQVar1;
  undefined1 *puVar2;
  undefined1 *puVar3;
  _Storage<QFileInfo,_false> _Var4;
  char16_t *pcVar5;
  QArrayData *pQVar6;
  char *pcVar7;
  undefined1 *puVar8;
  bool bVar9;
  int iVar10;
  pointer puVar11;
  pointer puVar12;
  undefined8 extraout_RAX;
  pointer puVar13;
  pointer puVar14;
  long in_FS_OFFSET;
  _Storage<QFileInfo,_false> local_138;
  char16_t *pcStack_130;
  undefined1 *local_128;
  QArrayData *pQStack_120;
  char *local_118;
  undefined1 *puStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  _Storage<QFileInfo,_false> local_c8;
  ulong uStack_c0;
  _Storage<QFileInfo,_false> local_b8;
  char16_t *pcStack_b0;
  undefined1 *local_a8;
  QArrayData *pQStack_a0;
  char *local_98;
  undefined1 *puStack_90;
  undefined8 local_88;
  undefined1 *puStack_80;
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  _Storage<QFileInfo,_false> local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->engine)._M_t.
      super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>._M_t.
      super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>.
      super__Head_base<0UL,_QAbstractFileEngine_*,_false>._M_head_impl == (QAbstractFileEngine *)0x0
     ) {
    local_48 = (_Storage<QFileInfo,_false>)&DAT_aaaaaaaaaaaaaaaa;
    puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
    local_a8 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_a0 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8 = (_Storage<QFileInfo,_false>)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_b0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)&local_b8._M_value);
    puStack_80 = (undefined1 *)0x0;
    local_78 = (undefined1 *)0xffffffffffffffff;
    puStack_70 = (undefined1 *)0x0;
    local_68 = (undefined1 *)0x0;
    puStack_60 = (undefined1 *)0x0;
    local_58 = (undefined1 *)0x0;
    puStack_50 = (undefined1 *)0xfffffffefffffffe;
    puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffffffffff00);
    puVar14 = (this->nativeIterators).
              super__Vector_base<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar12 = (this->nativeIterators).
              super__Vector_base<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar14 != puVar12) {
      do {
        if (puVar14 == puVar12) goto LAB_00230502;
        while (bVar9 = QFileSystemIterator::advance
                                 (puVar12[-1]._M_t.
                                  super___uniq_ptr_impl<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_QFileSystemIterator_*,_std::default_delete<QFileSystemIterator>_>
                                  .super__Head_base<0UL,_QFileSystemIterator_*,_false>._M_head_impl,
                                  (QFileSystemEntry *)&local_b8._M_value,
                                  (QFileSystemMetaData *)&puStack_80), bVar9) {
          bVar9 = entryMatches(this,(QDirEntryInfo *)&local_b8._M_value);
          puVar8 = local_88;
          if (bVar9) {
            _Var4 = (_Storage<QFileInfo,_false>)(this->currentEntryInfo).entry.m_filePath.d.d;
            pcVar5 = (this->currentEntryInfo).entry.m_filePath.d.ptr;
            (this->currentEntryInfo).entry.m_filePath.d.d = (Data *)local_b8;
            (this->currentEntryInfo).entry.m_filePath.d.ptr = pcStack_b0;
            puVar2 = (undefined1 *)(this->currentEntryInfo).entry.m_filePath.d.size;
            (this->currentEntryInfo).entry.m_filePath.d.size = (qsizetype)local_a8;
            pQVar6 = &((this->currentEntryInfo).entry.m_nativeFilePath.d.d)->super_QArrayData;
            pcVar7 = (this->currentEntryInfo).entry.m_nativeFilePath.d.ptr;
            (this->currentEntryInfo).entry.m_nativeFilePath.d.d = (Data *)pQStack_a0;
            (this->currentEntryInfo).entry.m_nativeFilePath.d.ptr = local_98;
            puVar3 = (undefined1 *)(this->currentEntryInfo).entry.m_nativeFilePath.d.size;
            (this->currentEntryInfo).entry.m_nativeFilePath.d.size = (qsizetype)puStack_90;
            (this->currentEntryInfo).entry.m_lastDotInFileName = local_88._4_2_;
            (this->currentEntryInfo).entry.m_lastSeparator = (undefined2)local_88;
            (this->currentEntryInfo).entry.m_firstDotInFileName = local_88._2_2_;
            *(undefined1 **)&(this->currentEntryInfo).metaData = puStack_80;
            (this->currentEntryInfo).metaData.size_ = (qint64)local_78;
            (this->currentEntryInfo).metaData.accessTime_ = (qint64)puStack_70;
            (this->currentEntryInfo).metaData.birthTime_ = (qint64)local_68;
            (this->currentEntryInfo).metaData.metadataChangeTime_ = (qint64)puStack_60;
            (this->currentEntryInfo).metaData.modificationTime_ = (qint64)local_58;
            *(undefined1 **)&(this->currentEntryInfo).metaData.userId_ = puStack_50;
            local_b8 = _Var4;
            pcStack_b0 = pcVar5;
            local_a8 = puVar2;
            pQStack_a0 = pQVar6;
            local_98 = pcVar7;
            puStack_90 = puVar3;
            local_88 = puVar8;
            std::_Optional_payload_base<QFileInfo>::_M_move_assign
                      ((_Optional_payload_base<QFileInfo> *)&(this->currentEntryInfo).fileInfoOpt,
                       (_Optional_payload_base<QFileInfo> *)&local_48._M_value);
            goto LAB_00230450;
          }
          local_c8 = (_Storage<QFileInfo,_false>)0x0;
          uStack_c0 = 0;
          local_d8 = 0;
          uStack_d0 = 0;
          local_e8 = 0;
          uStack_e0 = 0;
          local_f8 = 0;
          uStack_f0 = 0;
          local_108 = 0;
          uStack_100 = 0;
          local_118 = (char *)0x0;
          puStack_110 = (undefined1 *)0x0;
          local_128 = (undefined1 *)0x0;
          pQStack_120 = (QArrayData *)0x0;
          local_138 = (_Storage<QFileInfo,_false>)0x0;
          pcStack_130 = (char16_t *)0x0;
          QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)&local_138._M_value);
          puVar2 = puStack_90;
          pcVar7 = local_98;
          pQVar6 = pQStack_a0;
          puVar8 = local_a8;
          pcVar5 = pcStack_b0;
          _Var4 = local_b8;
          uStack_100 = 0;
          local_f8 = 0xffffffffffffffff;
          uStack_e0 = 0;
          local_d8 = 0;
          uStack_f0 = 0;
          local_e8 = 0;
          uStack_d0 = 0xfffffffefffffffe;
          uStack_c0 = uStack_c0 & 0xffffffffffffff00;
          local_b8 = local_138;
          pcStack_b0 = pcStack_130;
          local_138 = _Var4;
          pcStack_130 = pcVar5;
          local_a8 = local_128;
          local_128 = puVar8;
          pQStack_a0 = pQStack_120;
          local_98 = local_118;
          pQStack_120 = pQVar6;
          local_118 = pcVar7;
          puStack_90 = puStack_110;
          puStack_110 = puVar2;
          local_88 = (undefined1 *)
                     CONCAT44(CONCAT22(local_88._6_2_,local_108._4_2_),(undefined4)local_108);
          puStack_50 = (undefined1 *)0xfffffffefffffffe;
          puStack_60 = (undefined1 *)0x0;
          local_58 = (undefined1 *)0x0;
          puStack_70 = (undefined1 *)0x0;
          local_68 = (undefined1 *)0x0;
          puStack_80 = (undefined1 *)0x0;
          local_78 = (undefined1 *)0xffffffffffffffff;
          std::_Optional_payload_base<QFileInfo>::_M_move_assign
                    ((_Optional_payload_base<QFileInfo> *)&local_48._M_value,
                     (_Optional_payload_base<QFileInfo> *)&local_c8._M_value);
          if ((char)uStack_c0 == '\x01') {
            uStack_c0 = uStack_c0 & 0xffffffffffffff00;
            QFileInfo::~QFileInfo(&local_c8._M_value);
          }
          if (pQStack_120 != (QArrayData *)0x0) {
            LOCK();
            (pQStack_120->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQStack_120->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQStack_120->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQStack_120,1,0x10);
            }
          }
          if ((QArrayData *)local_138.field2 != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_138 = *(int *)local_138 + -1;
            UNLOCK();
            if (*(int *)local_138 == 0) {
              QArrayData::deallocate((QArrayData *)local_138,2,0x10);
            }
          }
          puVar12 = (this->nativeIterators).
                    super__Vector_base<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((this->nativeIterators).
              super__Vector_base<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == puVar12) goto LAB_00230502;
        }
        std::
        vector<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
        ::pop_back(&this->nativeIterators);
        puVar14 = (this->nativeIterators).
                  super__Vector_base<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar12 = (this->nativeIterators).
                  super__Vector_base<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>,_std::allocator<std::unique_ptr<QFileSystemIterator,_std::default_delete<QFileSystemIterator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (puVar14 != puVar12);
    }
LAB_00230450:
joined_r0x00230458:
    if ((char)puStack_40 == '\x01') {
      puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffffffffff00);
      QFileInfo::~QFileInfo(&local_48._M_value);
    }
    if (pQStack_a0 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQStack_a0,1,0x10);
      }
    }
    if ((QArrayData *)local_b8.field2 != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_b8 = *(int *)local_b8 + -1;
      UNLOCK();
      if (*(int *)local_b8 == 0) {
        QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
      }
    }
  }
  else {
    puVar13 = (this->fileEngineIterators).
              super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar11 = (this->fileEngineIterators).
              super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar13 != puVar11) {
      do {
        if (puVar13 == puVar11) {
LAB_002304e6:
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            advance();
LAB_00230502:
            if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
              advance();
              QDirEntryInfo::~QDirEntryInfo((QDirEntryInfo *)&local_b8._M_value);
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                _Unwind_Resume(extraout_RAX);
              }
            }
          }
          goto LAB_0023058d;
        }
        while( true ) {
          pQVar1 = puVar11[-1]._M_t.
                   super___uniq_ptr_impl<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QAbstractFileEngineIterator_*,_std::default_delete<QAbstractFileEngineIterator>_>
                   .super__Head_base<0UL,_QAbstractFileEngineIterator_*,_false>._M_head_impl;
          iVar10 = (*pQVar1->_vptr_QAbstractFileEngineIterator[2])(pQVar1);
          if ((char)iVar10 == '\0') break;
          local_48 = (_Storage<QFileInfo,_false>)&DAT_aaaaaaaaaaaaaaaa;
          puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
          local_78 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
          local_88 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
          local_98 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
          local_a8 = &DAT_aaaaaaaaaaaaaaaa;
          pQStack_a0 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
          local_b8 = (_Storage<QFileInfo,_false>)&DAT_aaaaaaaaaaaaaaaa;
          pcStack_b0 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          QFileSystemEntry::QFileSystemEntry((QFileSystemEntry *)&local_b8._M_value);
          puStack_80 = (undefined1 *)0x0;
          local_78 = (undefined1 *)0xffffffffffffffff;
          puStack_60 = (undefined1 *)0x0;
          local_58 = (undefined1 *)0x0;
          puStack_70 = (undefined1 *)0x0;
          local_68 = (undefined1 *)0x0;
          puStack_50 = (undefined1 *)0xfffffffefffffffe;
          puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffffffffff00);
          (*pQVar1->_vptr_QAbstractFileEngineIterator[4])(&local_138,pQVar1);
          _Var4 = local_48;
          if ((char)puStack_40 == '\x01') {
            local_48 = local_138;
            local_138 = _Var4;
          }
          else {
            QFileInfo::QFileInfo(&local_48._M_value,&local_138._M_value);
            puStack_40 = (undefined1 *)CONCAT71(puStack_40._1_7_,1);
          }
          QFileInfo::~QFileInfo(&local_138._M_value);
          bVar9 = entryMatches(this,(QDirEntryInfo *)&local_b8._M_value);
          puVar8 = local_88;
          if (bVar9) {
            _Var4 = (_Storage<QFileInfo,_false>)(this->currentEntryInfo).entry.m_filePath.d.d;
            pcVar5 = (this->currentEntryInfo).entry.m_filePath.d.ptr;
            (this->currentEntryInfo).entry.m_filePath.d.d = (Data *)local_b8;
            (this->currentEntryInfo).entry.m_filePath.d.ptr = pcStack_b0;
            puVar2 = (undefined1 *)(this->currentEntryInfo).entry.m_filePath.d.size;
            (this->currentEntryInfo).entry.m_filePath.d.size = (qsizetype)local_a8;
            pQVar6 = &((this->currentEntryInfo).entry.m_nativeFilePath.d.d)->super_QArrayData;
            pcVar7 = (this->currentEntryInfo).entry.m_nativeFilePath.d.ptr;
            (this->currentEntryInfo).entry.m_nativeFilePath.d.d = (Data *)pQStack_a0;
            (this->currentEntryInfo).entry.m_nativeFilePath.d.ptr = local_98;
            puVar3 = (undefined1 *)(this->currentEntryInfo).entry.m_nativeFilePath.d.size;
            (this->currentEntryInfo).entry.m_nativeFilePath.d.size = (qsizetype)puStack_90;
            (this->currentEntryInfo).entry.m_lastDotInFileName = local_88._4_2_;
            (this->currentEntryInfo).entry.m_lastSeparator = (undefined2)local_88;
            (this->currentEntryInfo).entry.m_firstDotInFileName = local_88._2_2_;
            *(undefined1 **)&(this->currentEntryInfo).metaData = puStack_80;
            (this->currentEntryInfo).metaData.size_ = (qint64)local_78;
            (this->currentEntryInfo).metaData.accessTime_ = (qint64)puStack_70;
            (this->currentEntryInfo).metaData.birthTime_ = (qint64)local_68;
            (this->currentEntryInfo).metaData.metadataChangeTime_ = (qint64)puStack_60;
            (this->currentEntryInfo).metaData.modificationTime_ = (qint64)local_58;
            *(undefined1 **)&(this->currentEntryInfo).metaData.userId_ = puStack_50;
            local_b8 = _Var4;
            pcStack_b0 = pcVar5;
            local_a8 = puVar2;
            pQStack_a0 = pQVar6;
            local_98 = pcVar7;
            puStack_90 = puVar3;
            local_88 = puVar8;
            std::_Optional_payload_base<QFileInfo>::_M_move_assign
                      ((_Optional_payload_base<QFileInfo> *)&(this->currentEntryInfo).fileInfoOpt,
                       (_Optional_payload_base<QFileInfo> *)&local_48._M_value);
            goto joined_r0x00230458;
          }
          if ((char)puStack_40 == '\x01') {
            puStack_40 = (undefined1 *)((ulong)puStack_40 & 0xffffffffffffff00);
            QFileInfo::~QFileInfo(&local_48._M_value);
          }
          if (pQStack_a0 != (QArrayData *)0x0) {
            LOCK();
            (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQStack_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQStack_a0,1,0x10);
            }
          }
          if ((QArrayData *)local_b8.field2 != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_b8 = *(int *)local_b8 + -1;
            UNLOCK();
            if (*(int *)local_b8 == 0) {
              QArrayData::deallocate((QArrayData *)local_b8,2,0x10);
            }
          }
          puVar11 = (this->fileEngineIterators).
                    super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if ((this->fileEngineIterators).
              super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == puVar11) goto LAB_002304e6;
        }
        std::
        vector<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
        ::pop_back(&this->fileEngineIterators);
        puVar13 = (this->fileEngineIterators).
                  super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar11 = (this->fileEngineIterators).
                  super__Vector_base<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>,_std::allocator<std::unique_ptr<QAbstractFileEngineIterator,_std::default_delete<QAbstractFileEngineIterator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while (puVar13 != puVar11);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_0023058d:
  __stack_chk_fail();
}

Assistant:

void QDirListingPrivate::advance()
{
    // Use get() in both code paths below because the iterator returned by back()
    // may be invalidated due to reallocation when appending new iterators in
    // pushDirectory().

    if (engine) {
        while (!fileEngineIterators.empty()) {
            // Find the next valid iterator that matches the filters.
            QAbstractFileEngineIterator *it;
            while (it = fileEngineIterators.back().get(), it->advance()) {
                QDirEntryInfo entryInfo;
                entryInfo.fileInfoOpt = it->currentFileInfo();
                if (entryMatches(entryInfo)) {
                    currentEntryInfo = std::move(entryInfo);
                    return;
                }
            }

            fileEngineIterators.pop_back();
        }
    } else {
#ifndef QT_NO_FILESYSTEMITERATOR
        QDirEntryInfo entryInfo;
        while (!nativeIterators.empty()) {
            // Find the next valid iterator that matches the filters.
            QFileSystemIterator *it;
            while (it = nativeIterators.back().get(),
                   it->advance(entryInfo.entry, entryInfo.metaData)) {
                if (entryMatches(entryInfo)) {
                    currentEntryInfo = std::move(entryInfo);
                    return;
                }
                entryInfo = {};
            }

            nativeIterators.pop_back();
        }
#endif
    }
}